

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t createTagStringWithAlternates
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *trailing,int32_t trailingLength,char *alternateTags,
                  char *tag,int32_t tagCapacity,UErrorCode *err)

{
  bool bVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  long lVar4;
  uint uVar5;
  size_t __n;
  int iVar6;
  ulong uStack_f0;
  char alternateLang [12];
  char tagBuffer [157];
  
  UVar2 = *err;
  if (U_ZERO_ERROR < UVar2) {
LAB_002883e5:
    if (UVar2 != U_BUFFER_OVERFLOW_ERROR && U_ZERO_ERROR < UVar2) {
      return -1;
    }
LAB_00288459:
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if ((((3 < regionLength) || (5 < scriptLength)) ||
      (__n = (size_t)(uint)langLength, 0xb < langLength)) || (tag == (char *)0x0))
  goto LAB_00288459;
  uStack_f0 = __n;
  if (langLength < 1) {
    if (alternateTags != (char *)0x0) {
      uVar5 = uloc_getLanguage_63(alternateTags,alternateLang,0xc,err);
      UVar2 = *err;
      if (0xb < (int)uVar5 || U_ZERO_ERROR < UVar2) goto LAB_002883e5;
      if (uVar5 != 0) {
        __n = (size_t)(int)uVar5;
        lang = alternateLang;
        uStack_f0 = (ulong)uVar5;
        goto LAB_00288439;
      }
      uStack_f0 = 3;
      tagBuffer[2] = 'd';
      tagBuffer[0] = 'u';
      tagBuffer[1] = 'n';
      goto LAB_0028843e;
    }
    tagBuffer[2] = 'd';
    tagBuffer[0] = 'u';
    tagBuffer[1] = 'n';
    uStack_f0 = 3;
    iVar6 = 3;
    if (0 < scriptLength) goto LAB_0028853e;
    if (regionLength < 1) goto LAB_00288635;
LAB_00288574:
    tagBuffer[uStack_f0] = '_';
    iVar6 = (int)uStack_f0 + 1;
LAB_0028857f:
    memcpy(tagBuffer + iVar6,region,(ulong)(uint)regionLength);
    iVar6 = iVar6 + regionLength;
    bVar1 = true;
  }
  else {
LAB_00288439:
    memcpy(tagBuffer,lang,__n);
LAB_0028843e:
    iVar6 = (int)uStack_f0;
    if (scriptLength < 1) {
      if (alternateTags != (char *)0x0) {
        uVar5 = uloc_getScript_63(alternateTags,alternateLang,6,err);
        UVar2 = *err;
        if (5 < (int)uVar5 || U_ZERO_ERROR < UVar2) goto LAB_002883e5;
        if (0 < (int)uVar5) {
          if (0 < iVar6) {
            tagBuffer[uStack_f0] = '_';
            iVar6 = iVar6 + 1;
          }
          memcpy(tagBuffer + iVar6,alternateLang,(ulong)uVar5);
          uStack_f0 = (ulong)(iVar6 + uVar5);
        }
        goto LAB_00288562;
      }
      if (0 < regionLength) goto LAB_0028856f;
    }
    else {
      if (0 < iVar6) {
LAB_0028853e:
        tagBuffer[uStack_f0] = '_';
        iVar6 = (int)uStack_f0 + 1;
      }
      memcpy(tagBuffer + iVar6,script,(ulong)(uint)scriptLength);
      uStack_f0 = (ulong)(uint)(iVar6 + scriptLength);
LAB_00288562:
      iVar6 = (int)uStack_f0;
      if (0 < regionLength) {
LAB_0028856f:
        iVar6 = (int)uStack_f0;
        if (0 < iVar6) goto LAB_00288574;
        goto LAB_0028857f;
      }
      if (alternateTags != (char *)0x0) {
        uVar5 = uloc_getCountry_63(alternateTags,alternateLang,4,err);
        UVar2 = *err;
        if ((int)uVar5 < 4 && UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          bVar1 = 0 < (int)uVar5;
          if (0 < (int)uVar5) {
            if (0 < iVar6) {
              tagBuffer[uStack_f0] = '_';
              iVar6 = iVar6 + 1;
            }
            memcpy(tagBuffer + iVar6,alternateLang,(ulong)uVar5);
            iVar6 = iVar6 + uVar5;
          }
          goto LAB_0028863f;
        }
        goto LAB_002883e5;
      }
    }
LAB_00288635:
    bVar1 = false;
  }
LAB_0028863f:
  iVar3 = tagCapacity;
  if (iVar6 < tagCapacity) {
    iVar3 = iVar6;
  }
  memcpy(tag,tagBuffer,(long)iVar3);
  if (0 < trailingLength) {
    uVar5 = tagCapacity - iVar3;
    if ((*trailing != '@') && (0 < (int)uVar5)) {
      tag[iVar6] = '_';
      lVar4 = (long)iVar6 + 1;
      if (bVar1 || uVar5 < 2) {
        uVar5 = uVar5 - 1;
        iVar6 = (int)lVar4;
      }
      else {
        iVar6 = iVar6 + 2;
        tag[lVar4] = '_';
        uVar5 = uVar5 - 2;
      }
    }
    if (0 < (int)uVar5) {
      if ((uint)trailingLength <= uVar5) {
        uVar5 = trailingLength;
      }
      memmove(tag + iVar6,trailing,(ulong)uVar5);
    }
  }
  iVar3 = u_terminateChars_63(tag,tagCapacity,iVar6 + trailingLength,err);
  return iVar3;
}

Assistant:

static int32_t U_CALLCONV
createTagStringWithAlternates(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* trailing,
    int32_t trailingLength,
    const char* alternateTags,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err) {

    if (U_FAILURE(*err)) {
        goto error;
    }
    else if (tag == NULL ||
             tagCapacity <= 0 ||
             langLength >= ULOC_LANG_CAPACITY ||
             scriptLength >= ULOC_SCRIPT_CAPACITY ||
             regionLength >= ULOC_COUNTRY_CAPACITY) {
        goto error;
    }
    else {
        /**
         * ULOC_FULLNAME_CAPACITY will provide enough capacity
         * that we can build a string that contains the language,
         * script and region code without worrying about overrunning
         * the user-supplied buffer.
         **/
        char tagBuffer[ULOC_FULLNAME_CAPACITY];
        int32_t tagLength = 0;
        int32_t capacityRemaining = tagCapacity;
        UBool regionAppended = FALSE;

        if (langLength > 0) {
            appendTag(
                lang,
                langLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags == NULL) {
            /*
             * Append the value for an unknown language, if
             * we found no language.
             */
            appendTag(
                unknownLanguage,
                (int32_t)uprv_strlen(unknownLanguage),
                tagBuffer,
                &tagLength);
        }
        else {
            /*
             * Parse the alternateTags string for the language.
             */
            char alternateLang[ULOC_LANG_CAPACITY];
            int32_t alternateLangLength = sizeof(alternateLang);

            alternateLangLength =
                uloc_getLanguage(
                    alternateTags,
                    alternateLang,
                    alternateLangLength,
                    err);
            if(U_FAILURE(*err) ||
                alternateLangLength >= ULOC_LANG_CAPACITY) {
                goto error;
            }
            else if (alternateLangLength == 0) {
                /*
                 * Append the value for an unknown language, if
                 * we found no language.
                 */
                appendTag(
                    unknownLanguage,
                    (int32_t)uprv_strlen(unknownLanguage),
                    tagBuffer,
                    &tagLength);
            }
            else {
                appendTag(
                    alternateLang,
                    alternateLangLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (scriptLength > 0) {
            appendTag(
                script,
                scriptLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the script.
             */
            char alternateScript[ULOC_SCRIPT_CAPACITY];

            const int32_t alternateScriptLength =
                uloc_getScript(
                    alternateTags,
                    alternateScript,
                    sizeof(alternateScript),
                    err);

            if (U_FAILURE(*err) ||
                alternateScriptLength >= ULOC_SCRIPT_CAPACITY) {
                goto error;
            }
            else if (alternateScriptLength > 0) {
                appendTag(
                    alternateScript,
                    alternateScriptLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (regionLength > 0) {
            appendTag(
                region,
                regionLength,
                tagBuffer,
                &tagLength);

            regionAppended = TRUE;
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the region.
             */
            char alternateRegion[ULOC_COUNTRY_CAPACITY];

            const int32_t alternateRegionLength =
                uloc_getCountry(
                    alternateTags,
                    alternateRegion,
                    sizeof(alternateRegion),
                    err);
            if (U_FAILURE(*err) ||
                alternateRegionLength >= ULOC_COUNTRY_CAPACITY) {
                goto error;
            }
            else if (alternateRegionLength > 0) {
                appendTag(
                    alternateRegion,
                    alternateRegionLength,
                    tagBuffer,
                    &tagLength);

                regionAppended = TRUE;
            }
        }

        {
            const int32_t toCopy =
                tagLength >= tagCapacity ? tagCapacity : tagLength;

            /**
             * Copy the partial tag from our internal buffer to the supplied
             * target.
             **/
            uprv_memcpy(
                tag,
                tagBuffer,
                toCopy);

            capacityRemaining -= toCopy;
        }

        if (trailingLength > 0) {
            if (*trailing != '@' && capacityRemaining > 0) {
                tag[tagLength++] = '_';
                --capacityRemaining;
                if (capacityRemaining > 0 && !regionAppended) {
                    /* extra separator is required */
                    tag[tagLength++] = '_';
                    --capacityRemaining;
                }
            }

            if (capacityRemaining > 0) {
                /*
                 * Copy the trailing data into the supplied buffer.  Use uprv_memmove, since we
                 * don't know if the user-supplied buffers overlap.
                 */
                const int32_t toCopy =
                    trailingLength >= capacityRemaining ? capacityRemaining : trailingLength;

                uprv_memmove(
                    &tag[tagLength],
                    trailing,
                    toCopy);
            }
        }

        tagLength += trailingLength;

        return u_terminateChars(
                    tag,
                    tagCapacity,
                    tagLength,
                    err);
    }

error:

    /**
     * An overflow indicates the locale ID passed in
     * is ill-formed.  If we got here, and there was
     * no previous error, it's an implicit overflow.
     **/
    if (*err ==  U_BUFFER_OVERFLOW_ERROR ||
        U_SUCCESS(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}